

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

void __thiscall cmUVProcessChain::cmUVProcessChain(cmUVProcessChain *this)

{
  _Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> __s;
  
  __s._M_head_impl = (InternalData *)operator_new(0xb0);
  memset(__s._M_head_impl,0,0x98);
  ((__s._M_head_impl)->InputStreamData).BuiltinStream = 0xffffffff;
  ((__s._M_head_impl)->OutputStreamData).BuiltinStream = 0xffffffff;
  ((__s._M_head_impl)->ErrorStreamData).BuiltinStream = 0xffffffff;
  *(undefined8 *)
   &((__s._M_head_impl)->Processes).
    super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
       = 0;
  *(pointer *)((long)&(__s._M_head_impl)->Processes + 8) = (pointer)0x0;
  *(pointer *)((long)&(__s._M_head_impl)->Processes + 0x10) = (pointer)0x0;
  *(undefined8 *)&((__s._M_head_impl)->TempOutputPipe).super_uv_handle_ptr_<uv_pipe_s> = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(__s._M_head_impl)->TempOutputPipe + 8))->
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&((__s._M_head_impl)->TempErrorPipe).super_uv_handle_ptr_<uv_pipe_s> = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(__s._M_head_impl)->TempErrorPipe + 8))->
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__s._M_head_impl)->ProcessesCompleted = 0;
  (this->Data)._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl = __s._M_head_impl;
  return;
}

Assistant:

cmUVProcessChain::cmUVProcessChain()
  : Data(cm::make_unique<InternalData>())
{
}